

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

yrmcds_error connect_to_server(char *node,uint16_t port,int *server_fd)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  addrinfo *res;
  int ok;
  socklen_t l;
  char sport [8];
  int local_7c;
  addrinfo *local_78;
  pollfd local_6c;
  socklen_t local_64;
  char local_60 [8];
  addrinfo local_58;
  
  if (node == (char *)0x0) {
    return YRMCDS_BAD_ARGUMENT;
  }
  snprintf(local_60,8,"%u",port);
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  local_58.ai_flags = 0x420;
  local_58.ai_family = 2;
  iVar1 = getaddrinfo(node,local_60,&local_58,&local_78);
  if ((iVar1 + 9U < 8) && ((0x99U >> (iVar1 + 9U & 0x1f) & 1) != 0)) {
    local_58.ai_flags = 0x408;
    local_58.ai_family = 10;
    iVar1 = getaddrinfo(node,local_60,&local_58,&local_78);
  }
  if (iVar1 == -0xb) {
    return YRMCDS_SYSTEM_ERROR;
  }
  if (iVar1 != 0) {
    return YRMCDS_NOT_RESOLVED;
  }
  iVar1 = socket(local_78->ai_family,local_78->ai_socktype | 0x80800,local_78->ai_protocol);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    freeaddrinfo(local_78);
    *piVar4 = iVar1;
    return YRMCDS_SYSTEM_ERROR;
  }
  iVar2 = connect(iVar1,local_78->ai_addr,local_78->ai_addrlen);
  local_7c = iVar2;
  freeaddrinfo(local_78);
  if (iVar2 != 0) {
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (iVar2 != 0x73) {
        close(iVar1);
        *piVar4 = iVar2;
        return YRMCDS_SYSTEM_ERROR;
      }
    }
    local_6c.events = 4;
    local_6c.fd = iVar1;
    iVar2 = poll(&local_6c,1,5000);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      close(iVar1);
      *piVar4 = iVar2;
      return YRMCDS_SYSTEM_ERROR;
    }
    if (iVar2 == 0) {
      close(iVar1);
      return YRMCDS_TIMEOUT;
    }
    if (((byte)local_6c.revents & 0x38) != 0) {
      close(iVar1);
      return YRMCDS_DISCONNECTED;
    }
    local_64 = 4;
    iVar2 = getsockopt(iVar1,1,4,&local_7c,&local_64);
    if (iVar2 == -1) {
      close(iVar1);
      return YRMCDS_SYSTEM_ERROR;
    }
    if (local_7c != 0) {
      close(iVar1);
      iVar1 = local_7c;
      piVar4 = __errno_location();
      *piVar4 = iVar1;
      return YRMCDS_SYSTEM_ERROR;
    }
  }
  uVar3 = fcntl(iVar1,3,0);
  iVar2 = fcntl(iVar1,4,(long)(int)(uVar3 & 0xfffff7ff));
  if (iVar2 != -1) {
    local_6c.fd = 1;
    iVar2 = setsockopt(iVar1,6,1,&local_6c,4);
    if (iVar2 != -1) {
      *server_fd = iVar1;
      return YRMCDS_OK;
    }
  }
  piVar4 = __errno_location();
  local_7c = *piVar4;
  close(iVar1);
  *piVar4 = local_7c;
  return YRMCDS_SYSTEM_ERROR;
}

Assistant:

static yrmcds_error connect_to_server(const char* node, uint16_t port, int* server_fd) {
    if( node == NULL )
        return YRMCDS_BAD_ARGUMENT;

    long fl;
    char sport[8];
    snprintf(sport, sizeof(sport), "%u", (unsigned int)port);

    struct addrinfo hint, *res;
    memset(&hint, 0, sizeof(hint));
    hint.ai_family = AF_INET;  // prefer IPv4
    hint.ai_socktype = SOCK_STREAM;
    hint.ai_flags = AI_NUMERICSERV|AI_ADDRCONFIG;
    int e = getaddrinfo(node, sport, &hint, &res);
    if( e == EAI_FAMILY || e == EAI_NONAME
#ifdef EAI_ADDRFAMILY
        || e == EAI_ADDRFAMILY
#endif
#ifdef EAI_NODATA
        || e == EAI_NODATA
#endif
        ) {
        hint.ai_family = AF_INET6;
        // intentionally drop AI_ADDRCONFIG to support IPv6 link-local address.
        // see https://github.com/cybozu/yrmcds/issues/40
        hint.ai_flags = AI_NUMERICSERV|AI_V4MAPPED;
        e = getaddrinfo(node, sport, &hint, &res);
    }
    if( e == EAI_SYSTEM ) {
        return YRMCDS_SYSTEM_ERROR;
    } else if( e != 0 ) {
        return YRMCDS_NOT_RESOLVED;
    }

    int s = socket(res->ai_family,
                   res->ai_socktype
#ifdef __linux__
                   | SOCK_NONBLOCK | SOCK_CLOEXEC
#endif
                   , res->ai_protocol);
    if( s == -1 ) {
        e = errno;
        freeaddrinfo(res);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
#ifndef __linux__
    fl = fcntl(s, F_GETFD, 0);
    fcntl(s, F_SETFD, fl | FD_CLOEXEC);
    fl = fcntl(s, F_GETFL, 0);
    fcntl(s, F_SETFL, fl | O_NONBLOCK);
#endif
    e = connect(s, res->ai_addr, res->ai_addrlen);
    freeaddrinfo(res);
    if( e == -1 && errno != EINPROGRESS ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }

    if( e != 0 ) {
        struct pollfd fds;
        fds.fd = s;
        fds.events = POLLOUT;
        int n = poll(&fds, 1, 5000);
        if( n == 0 ) { // timeout
            close(s);
            return YRMCDS_TIMEOUT;
        }
        if( n == -1 ) {
            e = errno;
            close(s);
            errno = e;
            return YRMCDS_SYSTEM_ERROR;
        }

        if( fds.revents & (POLLERR|POLLHUP|POLLNVAL) ) {
            close(s);
            return YRMCDS_DISCONNECTED;
        }
        socklen_t l = sizeof(e);
        if( getsockopt(s, SOL_SOCKET, SO_ERROR, &e, &l) == -1 ) {
            close(s);
            return YRMCDS_SYSTEM_ERROR;
        }
        if( e != 0 ) {
            close(s);
            errno = e;
            return YRMCDS_SYSTEM_ERROR;
        }
    }
    fl = fcntl(s, F_GETFL, 0);
    if( fcntl(s, F_SETFL, fl & ~O_NONBLOCK) == -1 ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
    int ok = 1;
    if( setsockopt(s, IPPROTO_TCP, TCP_NODELAY, &ok, sizeof(ok)) == -1 ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
    *server_fd = s;
    return YRMCDS_OK;
}